

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O1

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int _w;
  Mat local_78;
  int local_34;
  
  iVar5 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  if (top_blob != bottom_blob) {
    piVar1 = bottom_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_34 = _w;
            free(*(void **)((long)top_blob->data + -8));
            _w = local_34;
          }
        }
        else {
          local_34 = _w;
          (**(code **)(*(long *)top_blob->allocator + 8))();
          _w = local_34;
        }
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar1 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar1;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->allocator = bottom_blob->allocator;
    iVar2 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar4 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar2;
    top_blob->h = iVar3;
    top_blob->c = iVar4;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (iVar5 == 2) {
    if (this->expand_w == 0) {
      if (this->expand_h == 0) {
        if (this->expand_c == 0) goto LAB_00129238;
        Mat::reshape(&local_78,bottom_blob,_w,_h,1,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
      else {
        Mat::reshape(&local_78,bottom_blob,_w,1,_h,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
    }
    else {
      Mat::reshape(&local_78,bottom_blob,1,_w,_h,opt->blob_allocator);
      if (&local_78 != top_blob) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 8))();
            }
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_78.data;
        top_blob->refcount = local_78.refcount;
        top_blob->elemsize = local_78.elemsize;
        top_blob->allocator = local_78.allocator;
        top_blob->dims = local_78.dims;
        top_blob->w = local_78.w;
        top_blob->h = local_78.h;
        top_blob->c = local_78.c;
        top_blob->cstep = local_78.cstep;
      }
      if (local_78.refcount == (int *)0x0) goto LAB_00129238;
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) goto LAB_00129238;
      if (local_78.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_78.allocator + 8))();
        goto LAB_00129238;
      }
    }
  }
  else {
    if (iVar5 != 1) goto LAB_00129238;
    if (this->expand_w == 0) {
      if (this->expand_h == 0) goto LAB_00129238;
      if (this->expand_c == 0) {
        Mat::reshape(&local_78,bottom_blob,_w,1,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
      else {
        Mat::reshape(&local_78,bottom_blob,_w,1,1,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
    }
    else if (this->expand_h == 0) {
      if (this->expand_c == 0) {
        Mat::reshape(&local_78,bottom_blob,1,_w,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
      else {
        Mat::reshape(&local_78,bottom_blob,1,_w,1,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 8))();
              }
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount == (int *)0x0) goto LAB_00129238;
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) goto LAB_00129238;
        if (local_78.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_78.allocator + 8))();
          goto LAB_00129238;
        }
      }
    }
    else {
      Mat::reshape(&local_78,bottom_blob,1,1,_w,opt->blob_allocator);
      if (&local_78 != top_blob) {
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + 1;
          UNLOCK();
        }
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 8))();
            }
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        top_blob->data = local_78.data;
        top_blob->refcount = local_78.refcount;
        top_blob->elemsize = local_78.elemsize;
        top_blob->allocator = local_78.allocator;
        top_blob->dims = local_78.dims;
        top_blob->w = local_78.w;
        top_blob->h = local_78.h;
        top_blob->c = local_78.c;
        top_blob->cstep = local_78.cstep;
      }
      if (local_78.refcount == (int *)0x0) goto LAB_00129238;
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) goto LAB_00129238;
      if (local_78.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_78.allocator + 8))();
        goto LAB_00129238;
      }
    }
  }
  if (local_78.data != (void *)0x0) {
    free(*(void **)((long)local_78.data + -8));
  }
LAB_00129238:
  if (top_blob->data == (void *)0x0) {
    iVar5 = -100;
  }
  else {
    iVar5 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (expand_w)
        {
            if (expand_h)
                top_blob = bottom_blob.reshape(1, 1, w, opt.blob_allocator);
            else if (expand_c)
                top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (expand_h)
        {
            if (expand_c)
                top_blob = bottom_blob.reshape(w, 1, 1, opt.blob_allocator);
            else
                top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }
    else if (dims == 2)
    {
        if (expand_w)
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        else if (expand_h)
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        else if (expand_c)
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}